

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

void Cloud_Restart(CloudManager *dd)

{
  uint uVar1;
  CloudSign CVar2;
  ulong uVar3;
  ulong uVar4;
  
  CVar2 = dd->one->s;
  if (CVar2 == dd->nSignCur) {
    CVar2 = CVar2 + 1;
    dd->nSignCur = CVar2;
    dd->one->s = CVar2;
    uVar1 = dd->nVars;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      dd->vars[uVar3]->s = dd->vars[uVar3]->s + 1;
    }
    dd->nNodesCur = uVar1 + 1;
    return;
  }
  __assert_fail("dd->one->s == dd->nSignCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                ,0xa9,"void Cloud_Restart(CloudManager *)");
}

Assistant:

void Cloud_Restart( CloudManager * dd )
{
    int i;
    assert( dd->one->s == dd->nSignCur );
    dd->nSignCur++;
    dd->one->s++;
    for ( i = 0; i < dd->nVars; i++ )
        dd->vars[i]->s++;
    dd->nNodesCur = 1 + dd->nVars;
}